

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

double __thiscall OpenMD::Polynomial<double>::evaluateDerivative(Polynomial<double> *this,double *x)

{
  bool bVar1;
  pointer ppVar2;
  double *in_RSI;
  _Rb_tree_iterator<std::pair<const_int,_double>_> *in_RDI;
  double dVar3;
  iterator i;
  CoefficientType coefficient;
  ExponentType exponent;
  double result;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_38;
  _Self local_30;
  double local_28;
  int local_1c;
  double local_18;
  double *local_10;
  
  local_18 = 0.0;
  local_10 = in_RSI;
  local_30._M_node =
       (_Base_ptr)
       std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::begin
                 (in_stack_ffffffffffffffb8);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::end
                   (in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_double>_> *)0x333c79);
    local_1c = ppVar2->first;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_double>_> *)0x333c89);
    local_28 = ppVar2->second;
    dVar3 = fastpow<double>(*local_10,local_1c + -1);
    local_18 = dVar3 * local_28 * (double)local_1c + local_18;
    std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator++(in_RDI);
  }
  return local_18;
}

Assistant:

Real evaluateDerivative(const Real& x) {
      Real result = Real();
      ExponentType exponent;
      CoefficientType coefficient;

      for (iterator i = polyPairMap_.begin(); i != polyPairMap_.end(); ++i) {
        exponent    = i->first;
        coefficient = i->second;
        result += fastpow(x, exponent - 1) * coefficient * exponent;
      }

      return result;
    }